

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O2

void __thiscall
Js::InterpreterStackFrame::
OP_GetPropertyForTypeOf<Js::OpLayoutT_ElementCP<Js::LayoutSizePolicy<(Js::LayoutSize)2>>const__unaligned>
          (InterpreterStackFrame *this,
          OpLayoutT_ElementCP<Js::LayoutSizePolicy<(Js::LayoutSize)2>_> *playout)

{
  FunctionBody *functionBody;
  PropertyId propertyId;
  Var pvVar1;
  InlineCache *inlineCache;
  
  pvVar1 = GetReg<unsigned_int>(this,playout->Instance);
  propertyId = GetPropertyIdFromCacheId(this,playout->inlineCacheIndex);
  functionBody = *(FunctionBody **)(this + 0x88);
  inlineCache = GetInlineCache(this,playout->inlineCacheIndex);
  pvVar1 = JavascriptOperators::PatchGetValueForTypeOf<false,Js::InlineCache>
                     (functionBody,inlineCache,playout->inlineCacheIndex,pvVar1,propertyId);
  SetReg<unsigned_int>(this,playout->Value,pvVar1);
  return;
}

Assistant:

void InterpreterStackFrame::OP_GetPropertyForTypeOf(unaligned T* playout)
    {
        Var instance = GetReg(playout->Instance);
        PropertyId propertyId = GetPropertyIdFromCacheId(playout->inlineCacheIndex);
        Var value = JavascriptOperators::PatchGetValueForTypeOf<false>(
            GetFunctionBody(),
            GetInlineCache(playout->inlineCacheIndex),
            playout->inlineCacheIndex,
            instance,
            propertyId
            );

        SetReg(playout->Value, value);

#ifdef TELEMETRY_INTERPRETER
        if (TELEMETRY_PROPERTY_OPCODE_FILTER(propertyId))
        {
            // `successful` will be true as PatchGetRootValue throws an exception if not found.
            this->scriptContext->GetTelemetry().GetOpcodeTelemetry().GetProperty(instance, propertyId, value, /*successful:*/true);
        }
#endif
    }